

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap_raster.cpp
# Opt level: O3

QImage * __thiscall
QRasterPlatformPixmap::toImage(QImage *__return_storage_ptr__,QRasterPlatformPixmap *this)

{
  QImage *this_00;
  QPaintEngine *this_01;
  bool bVar1;
  QPaintDevice *pQVar2;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->image;
  bVar1 = QImage::isNull(this_00);
  if ((((bVar1) || (this_01 = ((this->image).d)->paintEngine, this_01 == (QPaintEngine *)0x0)) ||
      ((this_01->field_0x14 & 1) == 0)) ||
     (pQVar2 = QPaintEngine::paintDevice(this_01), (QImage *)pQVar2 != this_00)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QImage::QImage(__return_storage_ptr__,this_00);
      return __return_storage_ptr__;
    }
  }
  else {
    local_38 = 0;
    uStack_30 = 0xffffffffffffffff;
    QImage::copy(__return_storage_ptr__,(EVP_PKEY_CTX *)this_00,(EVP_PKEY_CTX *)&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QImage QRasterPlatformPixmap::toImage() const
{
    if (!image.isNull()) {
        QImageData *data = const_cast<QImage &>(image).data_ptr();
        if (data->paintEngine && data->paintEngine->isActive()
            && data->paintEngine->paintDevice() == &image)
        {
            return image.copy();
        }
    }

    return image;
}